

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HierarchicalTaskNetworkComponent.cpp
# Opt level: O2

void __thiscall
AI::HierarchicalTaskNetworkComponent::createPlan
          (HierarchicalTaskNetworkComponent *this,TaskIdentifier goal)

{
  Planner *this_00;
  TaskParameters *parameters;
  World *this_01;
  GameMode *this_02;
  TaskDatabase *taskDatabase;
  mapped_type *initialTask;
  TaskIdentifier goal_local;
  Plan local_a8;
  
  goal_local = goal;
  this_01 = Component::getWorld(&this->super_Component);
  this_02 = World::getAuthGameMode(this_01);
  taskDatabase = GameMode::getAvailableTasks(this_02);
  initialTask = std::
                map<AI::TaskIdentifier,_AI::Task,_std::less<AI::TaskIdentifier>,_std::allocator<std::pair<const_AI::TaskIdentifier,_AI::Task>_>_>
                ::operator[](&taskDatabase->tasks,&goal_local);
  this_00 = &this->planner;
  parameters = &(this->planner).parameters;
  generatePlan(&local_a8,initialTask,&this->state,&this->worldQuerySystem,parameters,taskDatabase);
  Plan::operator=(&this_00->plan,&local_a8);
  Plan::~Plan(&local_a8);
  if ((this->planner).plan.failed == true) {
    fixFailedPlan(&this_00->plan,&this->state,parameters,taskDatabase);
    if ((this->planner).plan.failed == true) {
      createPlan(this,Null);
    }
  }
  Plan::start(&this_00->plan);
  updateHUD_PlanPath(this);
  return;
}

Assistant:

void HierarchicalTaskNetworkComponent::createPlan(TaskIdentifier goal)
{
	auto& tasks = getWorld()->getAuthGameMode()->getAvailableTasks();
	planner.plan = generatePlan(tasks.tasks[goal], state, worldQuerySystem, planner.parameters, tasks);

	if (planner.plan.failed)
	{
		fixFailedPlan(planner.plan, state, planner.parameters, tasks);

		if (planner.plan.failed)
		{
			createPlan(TaskIdentifier::Null);
		}
	}

	planner.plan.start();
	updateHUD_PlanPath();
}